

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O3

clock_t __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<true>_>::clock
          (fm_engine_base<ymfm::opn_registers_base<true>_> *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint in_ESI;
  uint32_t chnum;
  long lVar4;
  uint32_t chnum_1;
  
  this->m_total_clocks = this->m_total_clocks + '\x01';
  if ((this->m_modified_channels != 0) ||
     (uVar1 = this->m_prepare_count, this->m_prepare_count = uVar1 + 1, 0xfff < uVar1)) {
    this->m_active_channels = 0;
    lVar4 = 0;
    do {
      if ((in_ESI >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        bVar2 = fm_channel<ymfm::opn_registers_base<true>_>::prepare
                          ((fm_channel<ymfm::opn_registers_base<true>_> *)
                           this->m_channel[lVar4]._M_t.
                           super___uniq_ptr_impl<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                           .
                           super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_false>
                          );
        if (bVar2) {
          this->m_active_channels = this->m_active_channels | 1 << ((byte)lVar4 & 0x1f);
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    this->m_modified_channels = 0;
    this->m_prepare_count = 0;
  }
  uVar1 = this->m_env_counter + 1;
  uVar3 = this->m_env_counter + 2;
  if ((~uVar1 & 3) != 0) {
    uVar3 = uVar1;
  }
  this->m_env_counter = uVar3;
  opn_registers_base<true>::clock_noise_and_lfo(&this->m_regs);
  lVar4 = 0;
  do {
    if ((in_ESI >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      fm_channel<ymfm::opn_registers_base<true>_>::clock
                ((fm_channel<ymfm::opn_registers_base<true>_> *)
                 this->m_channel[lVar4]._M_t.
                 super___uniq_ptr_impl<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                 .super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_false>)
      ;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  return (ulong)this->m_env_counter;
}

Assistant:

uint32_t fm_engine_base<RegisterType>::clock(uint32_t chanmask)
{
	// update the clock counter
	m_total_clocks++;

	// if something was modified, prepare
	// also prepare every 4k samples to catch ending notes
	if (m_modified_channels != 0 || m_prepare_count++ >= 4096)
	{
		// reassign operators to channels if dynamic
		if (RegisterType::DYNAMIC_OPS)
			assign_operators();

		// call each channel to prepare
		m_active_channels = 0;
		for (uint32_t chnum = 0; chnum < CHANNELS; chnum++)
			if (bitfield(chanmask, chnum))
				if (m_channel[chnum]->prepare())
					m_active_channels |= 1 << chnum;

		// reset the modified channels and prepare count
		m_modified_channels = m_prepare_count = 0;
	}

	// if the envelope clock divider is 1, just increment by 4;
	// otherwise, increment by 1 and manually wrap when we reach the divide count
	if (RegisterType::EG_CLOCK_DIVIDER == 1)
		m_env_counter += 4;
	else if (bitfield(++m_env_counter, 0, 2) == RegisterType::EG_CLOCK_DIVIDER)
		m_env_counter += 4 - RegisterType::EG_CLOCK_DIVIDER;

	// clock the noise generator
	int32_t lfo_raw_pm = m_regs.clock_noise_and_lfo();

	// now update the state of all the channels and operators
	for (uint32_t chnum = 0; chnum < CHANNELS; chnum++)
		if (bitfield(chanmask, chnum))
			m_channel[chnum]->clock(m_env_counter, lfo_raw_pm);

	// return the envelope counter as it is used to clock ADPCM-A
	return m_env_counter;
}